

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_BasicCommands.c
# Opt level: O1

void test_CmdSynch(void)

{
  XcpLight_self.session_status = XcpLight_self.session_status | 2;
  XcpLight_self.protection_status = '\0';
  cmdMsg.length = 1;
  cmdMsg.payload[0] = 0xfc;
  XcpLight_processCommand(&cmdMsg);
  UnityAssertEqualNumber(2,(ulong)(byte)reply_msg.length,(char *)0x0,0x5c,UNITY_DISPLAY_STYLE_UINT8)
  ;
  UnityAssertEqualNumber
            (0xfe,(ulong)reply_msg.payload[0],(char *)0x0,0x5d,UNITY_DISPLAY_STYLE_UINT8);
  UnityAssertEqualNumber(0,(ulong)reply_msg.payload[1],(char *)0x0,0x5e,UNITY_DISPLAY_STYLE_UINT8);
  return;
}

Assistant:

void test_CmdSynch(void)
{
  SET_SESSION_CONNECTED();
  SET_UNLOCK_ALL_RESOURCES();
  cmdMsg.length = 1u;
  cmdMsg.payload[0] = XCP_CMD_SYNCH;

  XcpLight_processCommand(&cmdMsg);

  TEST_ASSERT_EQUAL_UINT8(   2u, reply_msg.length);
  TEST_ASSERT_EQUAL_UINT8(0xFEu,  reply_msg.payload[0]); // XCP_PID_ERR
  TEST_ASSERT_EQUAL_UINT8(0x00u, reply_msg.payload[1]);  // ERR_CMD_SYNCH
}